

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * MyGame_Example_Test_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  char *pcVar1;
  uint64_t uVar2;
  char *buf_00;
  int8_t val_1;
  int16_t val;
  int more;
  int16_t *local_38;
  
  local_38 = (int16_t *)struct_base;
  pcVar1 = flatcc_json_parser_object_start(ctx,buf,end,&more);
  do {
    if (more == 0) {
      return pcVar1;
    }
    pcVar1 = flatcc_json_parser_symbol_start(ctx,pcVar1,end);
    uVar2 = flatcc_json_parser_symbol_part(pcVar1,end);
    if ((uVar2 & 0xff00000000000000) == 0x6100000000000000) {
      buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar1,end,1);
      if (pcVar1 == buf_00) goto LAB_0010d38e;
      val = 0;
      pcVar1 = flatcc_json_parser_int16(ctx,buf_00,end,&val);
      if ((buf_00 == pcVar1) &&
         ((pcVar1 = flatcc_json_parser_symbolic_int16
                              (ctx,pcVar1,end,
                               MyGame_Example_Test_parse_json_struct_inline::symbolic_parsers_1,&val
                              ), pcVar1 == buf_00 || (pcVar1 == end)))) goto LAB_0010d3bd;
      *local_38 = val;
    }
    else {
      buf_00 = pcVar1;
      if (((uVar2 & 0xff00000000000000) == 0x6200000000000000) &&
         (buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar1,end,1), pcVar1 != buf_00)) {
        val_1 = '\0';
        pcVar1 = flatcc_json_parser_int8(ctx,buf_00,end,&val_1);
        if ((buf_00 == pcVar1) &&
           ((pcVar1 = flatcc_json_parser_symbolic_int8
                                (ctx,pcVar1,end,
                                 MyGame_Example_Test_parse_json_struct_inline::symbolic_parsers,
                                 &val_1), pcVar1 == buf_00 || (pcVar1 == end)))) {
LAB_0010d3bd:
          pcVar1 = flatcc_json_parser_set_error(ctx,pcVar1,end,0x23);
          return pcVar1;
        }
        *(int8_t *)(local_38 + 1) = val_1;
      }
      else {
LAB_0010d38e:
        pcVar1 = flatcc_json_parser_unmatched_symbol(ctx,buf_00,end);
      }
    }
    pcVar1 = flatcc_json_parser_object_end(ctx,pcVar1,end,&more);
  } while( true );
}

Assistant:

static const char *MyGame_Example_Test_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if ((w & 0xff00000000000000) == 0x6200000000000000) { /* "b" */
            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
            if (mark != buf) {
                int8_t val = 0;
                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                        monster_test_local_MyGame_Example_json_parser_enum,
                        monster_test_global_json_parser_enum, 0 };
                pval = (void *)((size_t)struct_base + 2);
                buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                if (mark == buf) {
                    buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                    if (buf == mark || buf == end) goto failed;
                }
                flatbuffers_int8_write_to_pe(pval, val);
            } else {
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            }
        } else { /* "b" */
            if ((w & 0xff00000000000000) == 0x6100000000000000) { /* "a" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                if (mark != buf) {
                    int16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_int16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int16_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "a" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "a" */
        } /* "b" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}